

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId,
          RegSlot homeObj)

{
  bool bVar1;
  uchar local_30;
  uchar uStack_2f;
  uchar uStack_2e;
  uchar uStack_2d;
  RegSlot local_2c;
  OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  RegSlot homeObj_local;
  uint32 slotId_local;
  RegSlot instance_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_2c = homeObj;
  layout = (OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)slotId;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>(&uStack_2f,value);
  if ((((bVar1) &&
       (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                          (&uStack_2e,instance), bVar1)) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                         (&local_30,(uint)layout), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                        (&uStack_2d,local_2c), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,&local_30,4,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteElementSlotI3(OpCode op, RegSlot value, RegSlot instance, uint32 slotId, RegSlot homeObj)
    {
        OpLayoutT_ElementSlotI3<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value)
            && SizePolicy::Assign(layout.Instance, instance)
            && SizePolicy::Assign(layout.SlotIndex, slotId)
            && SizePolicy::Assign(layout.HomeObj, homeObj))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }